

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Glucose::Solver::adaptSolver(Solver *this)

{
  int iVar1;
  unsigned_long *puVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  bVar4 = (float)this->decisions / (float)this->conflicts <= 1.2;
  if (bVar4) {
    this->chanseokStrategy = true;
    this->coLBDBound = 4;
    this->glureduce = true;
    this->firstReduceDB = 2000;
    this->incReduceDB = 0;
    this->nbclausesbeforereduce = 2000;
    this->curRestart = this->conflicts / 2000 + 1;
  }
  puVar2 = (this->stats).data;
  if (puVar2[0x17] < 30000) {
    this->luby_restart = true;
    this->luby_restart_factor = 100;
    this->var_decay = 0.999;
    this->max_var_decay = 0.999;
    bVar5 = true;
  }
  else {
    bVar5 = bVar4;
    if (0xd480 < puVar2[0x17]) {
      bVar5 = true;
      this->chanseokStrategy = true;
      this->glureduce = true;
      this->coLBDBound = 3;
      this->firstReduceDB = 30000;
      this->var_decay = 0.99;
      this->max_var_decay = 0.99;
      this->randomize_on_restarts = true;
    }
  }
  if (puVar2[10] - puVar2[0xb] < 0x4e21) {
    if (!bVar5) goto LAB_00110b3f;
  }
  else {
    this->var_decay = 0.91;
    this->max_var_decay = 0.91;
  }
  (this->lbdQueue).queuesize = 0;
  (this->lbdQueue).first = 0;
  (this->lbdQueue).last = 0;
  (this->lbdQueue).sumofqueue = 0;
  this->sumLBD = 0.0;
  this->conflictsRestarts = 0;
  if ((this->chanseokStrategy == true) && (0 < (this->learnts).sz)) {
    lVar8 = 0;
    lVar9 = 0;
    iVar7 = 0;
    do {
      puVar3 = (this->learnts).data;
      if ((uint)this->coLBDBound <
          ((this->ca).super_RegionAllocator<unsigned_int>.memory[*(uint *)((long)puVar3 + lVar8)] >>
           0xb & 0xfffff)) {
        lVar6 = (long)iVar7;
        iVar7 = iVar7 + 1;
        puVar3[lVar6] = *(uint *)((long)puVar3 + lVar8);
      }
      else {
        vec<unsigned_int>::push(&this->permanentLearnts,(uint *)((long)puVar3 + lVar8));
      }
      lVar9 = lVar9 + 1;
      iVar1 = (this->learnts).sz;
      lVar8 = lVar8 + 4;
    } while (lVar9 < iVar1);
    if (0 < (int)lVar9 - iVar7) {
      (this->learnts).sz = (iVar7 + iVar1) - (int)lVar9;
    }
  }
LAB_00110b3f:
  if (bVar4) {
    if (0 < (this->learnts).sz) {
      lVar8 = 0;
      do {
        removeClause(this,(this->learnts).data[lVar8],false);
        lVar8 = lVar8 + 1;
        iVar7 = (this->learnts).sz;
      } while (lVar8 < iVar7);
      if (0 < iVar7) {
        (this->learnts).sz = 0;
      }
    }
    if ((double)(this->ca).super_RegionAllocator<unsigned_int>.sz * this->garbage_frac <
        (double)(this->ca).super_RegionAllocator<unsigned_int>.wasted_) {
      (*(this->super_Clone)._vptr_Clone[5])(this);
      return;
    }
  }
  return;
}

Assistant:

void Solver::adaptSolver() {
    bool adjusted = false;
    bool reinit = false;
    // printf("c\nc Try to adapt solver strategies\nc \n");
    /*  printf("c Adjusting solver for the SAT Race 2015 (alpha feature)\n");
    printf("c key successive Conflicts       : %" PRIu64"\n",stats[noDecisionConflict]);
    printf("c nb unary clauses learnt        : %" PRIu64"\n",stats[nbUn]);
    printf("c key avg dec per conflicts      : %.2f\n", (float)decisions / (float)conflicts);*/
    float decpc = (float) decisions / (float) conflicts;
    if(decpc <= 1.2) {
        chanseokStrategy = true;
        coLBDBound = 4;
        glureduce = true;
        adjusted = true;
        // printf("c Adjusting for low decision levels.\n");
        reinit = true;
        firstReduceDB = 2000;
        nbclausesbeforereduce = firstReduceDB;
        curRestart = (conflicts / nbclausesbeforereduce) + 1;
        incReduceDB = 0;
    }
    if(stats[noDecisionConflict] < 30000) {
        luby_restart = true;
        luby_restart_factor = 100;

        var_decay = 0.999;
        max_var_decay = 0.999;
        adjusted = true;
        // printf("c Adjusting for low successive conflicts.\n");
    }
    if(stats[noDecisionConflict] > 54400) {
        // printf("c Adjusting for high successive conflicts.\n");
        chanseokStrategy = true;
        glureduce = true;
        coLBDBound = 3;
        firstReduceDB = 30000;
        var_decay = 0.99;
        max_var_decay = 0.99;
        randomize_on_restarts = 1;
        adjusted = true;
    }
    if(stats[nbDL2] - stats[nbBin] > 20000) {
        var_decay = 0.91;
        max_var_decay = 0.91;
        adjusted = true;
        // printf("c Adjusting for a very large number of true glue clauses found.\n");
    }
    if(!adjusted) {
        // printf("c Nothing extreme in this problem, continue with glucose default strategies.\n");
    }
    // printf("c\n");
    if(adjusted) { // Let's reinitialize the glucose restart strategy counters
        lbdQueue.fastclear();
        sumLBD = 0;
        conflictsRestarts = 0;
    }

    if(chanseokStrategy && adjusted) {
        int moved = 0;
        int i, j;
        for(i = j = 0; i < learnts.size(); i++) {
            Clause &c = ca[learnts[i]];
            if(c.lbd() <= coLBDBound) {
                permanentLearnts.push(learnts[i]);
                moved++;
            }
            else {
                learnts[j++] = learnts[i];
            }
        }
        learnts.shrink(i - j);
        // printf("c Activating Chanseok Strategy: moved %d clauses to the permanent set.\n", moved);
    }

    if(reinit) {
        assert(decisionLevel() == 0);
        for(int i = 0; i < learnts.size(); i++) {
            removeClause(learnts[i]);
        }
        learnts.shrink(learnts.size());
        checkGarbage();
/*
	order_heap.clear();
	for(int i=0;i<nVars();i++) {
	    polarity[i] = true; 
	    activity[i]=0.0;
	    if (decision[i]) order_heap.insert(i);
	}
	printf("c reinitialization of all variables activity/phase/learnt clauses.\n");
*/
        // printf("c Removing of non permanent clauses.\n");
    }

}